

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  uint uVar1;
  DTableDesc DVar2;
  HUF_DTable *in_RDI;
  ulong in_R8;
  HUF_DEltX2 D;
  U32 u;
  U32 length;
  U32 w;
  U32 n_1;
  U32 current;
  U32 nextRankStart;
  U32 n;
  DTableDesc dtd;
  size_t spaceUsed32;
  BYTE *huffWeight;
  U32 *rankVal;
  HUF_DEltX2 *dt;
  void *dtPtr;
  size_t iSize;
  U32 nbSymbols;
  U32 tableLog;
  void *in_stack_000000b0;
  U32 *in_stack_000000b8;
  U32 *in_stack_000000c0;
  U32 *in_stack_000000c8;
  size_t in_stack_000000d0;
  BYTE *in_stack_000000d8;
  size_t in_stack_000000f0;
  undefined4 local_6c;
  undefined8 local_8;
  
  if (in_R8 < 0x140) {
    local_8 = 0xffffffffffffffd4;
  }
  else {
    local_8 = HUF_readStats(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                            in_stack_000000b8,in_stack_000000b0,in_stack_000000f0);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      DVar2 = HUF_getDTableDesc(in_RDI);
      local_6c._3_1_ = DVar2.reserved;
      local_6c._0_3_ = (uint3)DVar2.maxTableLog;
      *in_RDI = local_6c;
    }
  }
  return local_8;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;

    U32* rankVal;
    BYTE* huffWeight;
    size_t spaceUsed32 = 0;

    rankVal = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_ABSOLUTEMAX + 1;
    huffWeight = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    HUF_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX + 1, rankVal, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Calculate starting value for each rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<tableLog+1; n++) {
            U32 const current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill DTable */
    {   U32 n;
        for (n=0; n<nbSymbols; n++) {
            U32 const w = huffWeight[n];
            U32 const length = (1 << w) >> 1;
            U32 u;
            HUF_DEltX2 D;
            D.byte = (BYTE)n; D.nbBits = (BYTE)(tableLog + 1 - w);
            for (u = rankVal[w]; u < rankVal[w] + length; u++)
                dt[u] = D;
            rankVal[w] += length;
    }   }

    return iSize;
}